

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_c5789::NodeStoringImplicitDepLoader::ProcessDepfileDeps
          (NodeStoringImplicitDepLoader *this,Edge *edge,
          vector<StringPiece,_std::allocator<StringPiece>_> *depfile_ins,string *err)

{
  StringPiece *pSVar1;
  Node *node;
  uint64_t slash_bits;
  Node *local_38;
  uint64_t local_30;
  
  for (pSVar1 = (depfile_ins->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl
                .super__Vector_impl_data._M_start;
      pSVar1 != (depfile_ins->super__Vector_base<StringPiece,_std::allocator<StringPiece>_>)._M_impl
                .super__Vector_impl_data._M_finish; pSVar1 = pSVar1 + 1) {
    CanonicalizePath(pSVar1->str_,&pSVar1->len_,&local_30);
    local_38 = State::GetNode((this->super_ImplicitDepLoader).state_,*pSVar1,local_30);
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(this->dep_nodes_output_,&local_38);
  }
  return true;
}

Assistant:

bool NodeStoringImplicitDepLoader::ProcessDepfileDeps(
    Edge* edge, std::vector<StringPiece>* depfile_ins, std::string* err) {
  for (std::vector<StringPiece>::iterator i = depfile_ins->begin();
       i != depfile_ins->end(); ++i) {
    uint64_t slash_bits;
    CanonicalizePath(const_cast<char*>(i->str_), &i->len_, &slash_bits);
    Node* node = state_->GetNode(*i, slash_bits);
    dep_nodes_output_->push_back(node);
  }
  return true;
}